

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCase.h
# Opt level: O0

void AdditionHelper<signed_char,short,5>::
     AdditionThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,short *rhs,char *result)

{
  char cVar1;
  int iVar2;
  undefined1 *in_RDX;
  short *in_RSI;
  char *in_RDI;
  int32_t tmp;
  
  iVar2 = (int)*in_RDI + (int)*in_RSI;
  cVar1 = std::numeric_limits<signed_char>::max();
  if (iVar2 <= cVar1) {
    cVar1 = std::numeric_limits<signed_char>::min();
    if (cVar1 <= iVar2) {
      *in_RDX = (char)iVar2;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

TestVector() : test_cases(nullptr), count(0), current(0) {}